

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventRegistry.cpp
# Opt level: O0

void __thiscall
license::EventRegistry::addEvent
          (EventRegistry *this,LCC_EVENT_TYPE event,char *licenseLocationId,char *info)

{
  bool bVar1;
  pointer ppVar2;
  size_type sVar3;
  mapped_type_conflict1 *pmVar4;
  allocator local_5e1;
  key_type local_5e0;
  _Self local_5c0;
  allocator local_5b1;
  key_type local_5b0;
  _Self local_590 [3];
  allocator local_571;
  key_type local_570;
  int local_54c;
  const_iterator cStack_548;
  int step;
  byte local_539;
  const_iterator cStack_538;
  bool successEvent;
  const_iterator eventIterator;
  AuditEvent audit;
  char *info_local;
  char *licenseLocationId_local;
  EventRegistry *pEStack_10;
  LCC_EVENT_TYPE event_local;
  EventRegistry *this_local;
  
  audit.param2._248_8_ = info;
  licenseLocationId_local._4_4_ = event;
  pEStack_10 = this;
  cStack_538 = std::
               map<LCC_EVENT_TYPE,_int,_std::less<LCC_EVENT_TYPE>,_std::allocator<std::pair<const_LCC_EVENT_TYPE,_int>_>_>
               ::find((map<LCC_EVENT_TYPE,_int,_std::less<LCC_EVENT_TYPE>,_std::allocator<std::pair<const_LCC_EVENT_TYPE,_int>_>_>
                       *)PROGRESS_BY_EVENT_TYPE,(key_type *)((long)&licenseLocationId_local + 4));
  cStack_548 = std::
               map<LCC_EVENT_TYPE,_int,_std::less<LCC_EVENT_TYPE>,_std::allocator<std::pair<const_LCC_EVENT_TYPE,_int>_>_>
               ::end((map<LCC_EVENT_TYPE,_int,_std::less<LCC_EVENT_TYPE>,_std::allocator<std::pair<const_LCC_EVENT_TYPE,_int>_>_>
                      *)PROGRESS_BY_EVENT_TYPE);
  local_539 = std::operator!=(&stack0xfffffffffffffac8,&stack0xfffffffffffffab8);
  eventIterator._M_node._0_4_ = (uint)!(bool)local_539;
  eventIterator._M_node._4_4_ = licenseLocationId_local._4_4_;
  if (licenseLocationId == (char *)0x0) {
    strcpy((char *)&audit,"UNDEF");
  }
  else {
    strncpy((char *)&audit,licenseLocationId,0x400);
  }
  if (audit.param2._248_8_ == 0) {
    audit.license_reference[0x3f8] = '\0';
  }
  else {
    strncpy(audit.license_reference + 0x3f8,(char *)audit.param2._248_8_,0xff);
  }
  std::vector<AuditEvent,_std::allocator<AuditEvent>_>::push_back
            (&this->logs,(value_type *)&eventIterator);
  if ((local_539 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_5b0,(char *)&audit,&local_5b1);
    local_590[0]._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
         ::find(&this->mostAdvancedLogIdx_by_LicenseId,&local_5b0);
    local_5c0._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
         ::end(&this->mostAdvancedLogIdx_by_LicenseId);
    bVar1 = std::operator!=(local_590,&local_5c0);
    std::__cxx11::string::~string((string *)&local_5b0);
    std::allocator<char>::~allocator((allocator<char> *)&local_5b1);
    if (bVar1) {
      sVar3 = std::vector<AuditEvent,_std::allocator<AuditEvent>_>::size(&this->logs);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_5e0,(char *)&audit,&local_5e1);
      pmVar4 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
               ::operator[](&this->mostAdvancedLogIdx_by_LicenseId,&local_5e0);
      *pmVar4 = sVar3 - 1;
      std::__cxx11::string::~string((string *)&local_5e0);
      std::allocator<char>::~allocator((allocator<char> *)&local_5e1);
    }
  }
  else {
    ppVar2 = std::_Rb_tree_const_iterator<std::pair<const_LCC_EVENT_TYPE,_int>_>::operator->
                       (&stack0xfffffffffffffac8);
    local_54c = ppVar2->second;
    if (this->current_validation_step < local_54c) {
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
      ::clear(&this->mostAdvancedLogIdx_by_LicenseId);
      this->current_validation_step = local_54c;
    }
    if (local_54c == this->current_validation_step) {
      sVar3 = std::vector<AuditEvent,_std::allocator<AuditEvent>_>::size(&this->logs);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_570,(char *)&audit,&local_571);
      pmVar4 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
               ::operator[](&this->mostAdvancedLogIdx_by_LicenseId,&local_570);
      *pmVar4 = sVar3 - 1;
      std::__cxx11::string::~string((string *)&local_570);
      std::allocator<char>::~allocator((allocator<char> *)&local_571);
    }
  }
  return;
}

Assistant:

void EventRegistry::addEvent(LCC_EVENT_TYPE event, const char *licenseLocationId, const char *info) {
	AuditEvent audit;
	auto eventIterator = PROGRESS_BY_EVENT_TYPE.find(event);
	bool successEvent = (eventIterator != PROGRESS_BY_EVENT_TYPE.end());
	audit.severity = successEvent ? SVRT_INFO : SVRT_WARN;
	audit.event_type = event;
	if (licenseLocationId == nullptr) {
		strcpy(audit.license_reference, LIC_ID_NOT_DEFINED);
	} else {
		strncpy(audit.license_reference, licenseLocationId, MAX_PATH);
	}
	if (info == nullptr) {
		audit.param2[0] = '\0';
	} else {
		strncpy(audit.param2, info, 255);
	}
	logs.push_back(audit);
	// udpate the status of the log
	if (successEvent) {
		int step = eventIterator->second;
		if (step > current_validation_step) {
			mostAdvancedLogIdx_by_LicenseId.clear();
			current_validation_step = step;
		}

		if (step == current_validation_step) {
			mostAdvancedLogIdx_by_LicenseId[audit.license_reference] = logs.size() - 1;
		}
	} else if (mostAdvancedLogIdx_by_LicenseId.find(audit.license_reference) != mostAdvancedLogIdx_by_LicenseId.end()) {
		mostAdvancedLogIdx_by_LicenseId[audit.license_reference] = logs.size() - 1;
	}
}